

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  Float FVar1;
  float fVar2;
  uint uVar3;
  LensElementInterface *pLVar4;
  LensElementInterface *pLVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  Normal3f n;
  bool bVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  undefined1 auVar13 [64];
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  Point3f PVar17;
  Vector3<float> wi;
  Float t;
  Transform LensFromCamera;
  float local_140;
  float local_13c;
  Vector3f local_138;
  Tuple3<pbrt::Normal3,_float> local_128;
  Ray local_118;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Ray *local_c8;
  Tuple3<pbrt::Vector3,_float> local_c0;
  Transform local_b0;
  
  local_c8 = rOut;
  auVar13._0_4_ = LensFrontZ(this);
  auVar13._4_60_ = extraout_var;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  local_d8 = vxorps_avx512vl(auVar13._0_16_,auVar6);
  Scale(&local_b0,1.0,1.0,-1.0);
  lVar10 = 0;
  Transform::operator()(&local_118,&local_b0,rCamera,(Float *)0x0);
  uVar9 = 0;
  while( true ) {
    if ((this->elementInterfaces).nStored <= uVar9) {
      if (local_c8 != (Ray *)0x0) {
        auVar11._8_4_ = local_118.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_4_ = local_118.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar11._4_4_ = local_118.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar11._12_4_ = local_118.time;
        (local_c8->o).super_Tuple3<pbrt::Point3,_float>.x =
             local_118.o.super_Tuple3<pbrt::Point3,_float>.x;
        (local_c8->o).super_Tuple3<pbrt::Point3,_float>.y =
             local_118.o.super_Tuple3<pbrt::Point3,_float>.y;
        (local_c8->o).super_Tuple3<pbrt::Point3,_float>.z =
             -local_118.o.super_Tuple3<pbrt::Point3,_float>.z;
        (local_c8->d).super_Tuple3<pbrt::Vector3,_float>.x =
             local_118.d.super_Tuple3<pbrt::Vector3,_float>.x;
        (local_c8->d).super_Tuple3<pbrt::Vector3,_float>.y =
             local_118.d.super_Tuple3<pbrt::Vector3,_float>.y;
        (local_c8->d).super_Tuple3<pbrt::Vector3,_float>.z =
             -local_118.d.super_Tuple3<pbrt::Vector3,_float>.z;
        FVar1 = (Float)vextractps_avx(auVar11,3);
        local_c8->time = FVar1;
        (local_c8->medium).
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = 0;
      }
      return 1.0;
    }
    pLVar4 = (this->elementInterfaces).ptr;
    local_128.x = 0.0;
    local_128.y = 0.0;
    local_128.z = 0.0;
    FVar1 = *(Float *)((long)&pLVar4->curvatureRadius + lVar10);
    local_e8._0_4_ = FVar1;
    if ((FVar1 != 0.0) || (NAN(FVar1))) {
      bVar8 = IntersectSphericalElement
                        (FVar1,(float)local_d8._0_4_ + FVar1,&local_118,&local_140,
                         (Normal3f *)&local_128);
      if (!bVar8) {
        return 0.0;
      }
      auVar13 = ZEXT464((uint)local_140);
    }
    else {
      local_140 = ((float)local_d8._0_4_ - local_118.o.super_Tuple3<pbrt::Point3,_float>.z) /
                  local_118.d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),local_140));
      if (local_140 < 0.0) {
        return 0.0;
      }
    }
    auVar15 = auVar13._8_56_;
    PVar17 = Ray::operator()(&local_118,auVar13._0_4_);
    local_118.o.super_Tuple3<pbrt::Point3,_float>.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
    auVar14._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar15;
    fVar2 = *(float *)((long)&pLVar4->apertureRadius + lVar10);
    auVar11 = auVar14._0_16_;
    auVar16._0_4_ =
         PVar17.super_Tuple3<pbrt::Point3,_float>.x * PVar17.super_Tuple3<pbrt::Point3,_float>.x;
    auVar16._4_4_ =
         PVar17.super_Tuple3<pbrt::Point3,_float>.y * PVar17.super_Tuple3<pbrt::Point3,_float>.y;
    auVar16._8_4_ = auVar15._0_4_ * auVar15._0_4_;
    auVar16._12_4_ = auVar15._4_4_ * auVar15._4_4_;
    auVar6 = vmovshdup_avx(auVar16);
    auVar6 = vfmadd231ss_fma(auVar6,auVar11,auVar11);
    if (fVar2 * fVar2 < auVar6._0_4_) break;
    local_118.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11);
    if (((float)local_e8._0_4_ != 0.0) || (NAN((float)local_e8._0_4_))) {
      local_138.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_138.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      local_138.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      pLVar5 = (this->elementInterfaces).ptr;
      local_13c = 1.0;
      if (uVar9 != 0) {
        fVar2 = *(float *)((long)pLVar5 + lVar10 + -8);
        if ((fVar2 != 0.0) || (local_13c = 1.0, NAN(fVar2))) {
          local_13c = fVar2;
        }
      }
      uVar3 = *(uint *)((long)&pLVar5->eta + lVar10);
      uVar7 = vcmpss_avx512f(ZEXT416(uVar3),ZEXT816(0) << 0x20,4);
      bVar8 = (bool)((byte)uVar7 & 1);
      local_e8 = ZEXT416(bVar8 * uVar3 + (uint)!bVar8 * 0x3f800000);
      auVar12._0_8_ = local_118.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
      auVar12._8_4_ = 0x80000000;
      auVar12._12_4_ = 0x80000000;
      local_c0.z = -local_118.d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_c0._0_8_ = vmovlps_avx(auVar12);
      wi = Normalize<float>((Vector3<float> *)&local_c0);
      n.super_Tuple3<pbrt::Normal3,_float>.z = local_128.z;
      n.super_Tuple3<pbrt::Normal3,_float>.x = local_128.x;
      n.super_Tuple3<pbrt::Normal3,_float>.y = local_128.y;
      bVar8 = Refract((Vector3f)wi.super_Tuple3<pbrt::Vector3,_float>,n,local_e8._0_4_ / local_13c,
                      &local_138);
      if (!bVar8) {
        return 0.0;
      }
      local_118.d.super_Tuple3<pbrt::Vector3,_float>.z =
           local_138.super_Tuple3<pbrt::Vector3,_float>.z;
      local_118.d.super_Tuple3<pbrt::Vector3,_float>.x =
           local_138.super_Tuple3<pbrt::Vector3,_float>.x;
      local_118.d.super_Tuple3<pbrt::Vector3,_float>.y =
           local_138.super_Tuple3<pbrt::Vector3,_float>.y;
    }
    uVar9 = uVar9 + 1;
    local_d8._0_4_ = (float)local_d8._0_4_ + *(float *)((long)&pLVar4->thickness + lVar10);
    local_d8._4_4_ = 0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    lVar10 = lVar10 + 0x10;
  }
  return 0.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}